

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.cxx
# Opt level: O2

bool cmExportLibraryDependenciesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this;
  string *this_00;
  allocator<char> *this_01;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  allocator<char> local_98 [32];
  string local_78;
  GeneratorAction local_70;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_98 + 0x28),"called with incorrect number of arguments",local_98);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    this_01 = local_98 + 0x28;
  }
  else {
    if ((ulong)((long)pbVar2 - (long)pbVar1) < 0x21) {
      local_78 = (string)0x0;
    }
    else {
      local_78 = (string)std::operator==(pbVar1 + 1,"APPEND");
    }
    this = status->Makefile;
    std::__cxx11::string::string((string *)local_98,(string *)pbVar1);
    local_a8 = (code *)0x0;
    pcStack_a0 = (code *)0x0;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    this_00 = (string *)operator_new(0x28);
    std::__cxx11::string::string(this_00,(string *)local_98);
    this_00[0x20] = local_78;
    pcStack_a0 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmExportLibraryDependenciesCommand.cxx:158:5)>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmExportLibraryDependenciesCommand.cxx:158:5)>
               ::_M_manager;
    local_b8._M_unused._0_8_ = (undefined8)this_00;
    cmMakefile::GeneratorAction::GeneratorAction
              ((GeneratorAction *)(local_98 + 0x28),(ActionT *)&local_b8);
    cmMakefile::AddGeneratorAction(this,(GeneratorAction *)(local_98 + 0x28));
    cmMakefile::GeneratorAction::~GeneratorAction((GeneratorAction *)(local_98 + 0x28));
    std::_Function_base::~_Function_base((_Function_base *)&local_b8);
    this_01 = local_98;
  }
  std::__cxx11::string::~string((string *)this_01);
  return pbVar1 != pbVar2;
}

Assistant:

bool cmExportLibraryDependenciesCommand(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& filename = args[0];
  bool const append = args.size() > 1 && args[1] == "APPEND";
  status.GetMakefile().AddGeneratorAction(
    [filename, append](cmLocalGenerator& lg, const cmListFileBacktrace&) {
      FinalAction(*lg.GetMakefile(), filename, append);
    });

  return true;
}